

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_basis_file.cpp
# Opt level: O1

void __thiscall
basisu::basisu_file::create_comp_data(basisu_file *this,basisu_backend_output *encoder_output)

{
  uint8_vec *vec;
  uint uVar1;
  uchar *puVar2;
  vector<unsigned_char> *pvVar3;
  ulong uVar4;
  char *__function;
  uint uVar5;
  long lVar6;
  
  uVar5 = (this->m_comp_data).m_size;
  uVar4 = (ulong)uVar5;
  if ((uVar4 != 0) &&
     (puVar2 = (this->m_comp_data).m_p,
     this < (basisu_file *)(puVar2 + uVar4) && puVar2 < &this->field_0x4d)) {
    __assert_fail("(pObjs + n) <= vec.begin() || (pObjs >= vec.end())",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu.h"
                  ,0xb3,
                  "void basisu::append_vector(T &, const R *, size_t) [T = basisu::vector<unsigned char>, R = unsigned char]"
                 );
  }
  if (0xffffffb2 < uVar5) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                  ,0x217,
                  "void basisu::vector<unsigned char>::resize(size_t, bool) [T = unsigned char]");
  }
  vec = &this->m_comp_data;
  uVar5 = uVar5 + 0x4d;
  if ((this->m_comp_data).m_capacity < uVar5) {
    elemental_vector::increase_capacity
              ((elemental_vector *)vec,uVar5,false,1,(object_mover)0x0,false);
  }
  uVar1 = (this->m_comp_data).m_size;
  memset((this->m_comp_data).m_p + uVar1,0,(ulong)(uVar5 - uVar1));
  (this->m_comp_data).m_size = uVar5;
  memcpy((this->m_comp_data).m_p + uVar4,this,0x4d);
  if ((this->m_comp_data).m_size != this->m_slice_descs_file_ofs) {
    __assert_fail("m_comp_data.size() == m_slice_descs_file_ofs",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_basis_file.cpp"
                  ,0x98,"void basisu::basisu_file::create_comp_data(const basisu_backend_output &)")
    ;
  }
  uVar4 = (ulong)(this->m_images_descs).m_size;
  if (uVar4 == 0) {
    __assert_fail("i < m_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                  ,0x178,
                  "T &basisu::vector<basist::basis_slice_desc>::operator[](size_t) [T = basist::basis_slice_desc]"
                 );
  }
  append_vector<basisu::vector<unsigned_char>,unsigned_char>
            (vec,(uchar *)(this->m_images_descs).m_p,uVar4 * 0x17);
  if (encoder_output->m_uses_global_codebooks == false) {
    uVar4 = (ulong)(encoder_output->m_endpoint_palette).m_size;
    if (uVar4 != 0) {
      if ((this->m_comp_data).m_size != this->m_endpoint_cb_file_ofs) {
        __assert_fail("m_comp_data.size() == m_endpoint_cb_file_ofs",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_basis_file.cpp"
                      ,0x9f,
                      "void basisu::basisu_file::create_comp_data(const basisu_backend_output &)");
      }
      append_vector<basisu::vector<unsigned_char>,unsigned_char>
                (vec,(encoder_output->m_endpoint_palette).m_p,uVar4);
    }
    uVar4 = (ulong)(encoder_output->m_selector_palette).m_size;
    if (uVar4 != 0) {
      if ((this->m_comp_data).m_size != this->m_selector_cb_file_ofs) {
        __assert_fail("m_comp_data.size() == m_selector_cb_file_ofs",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_basis_file.cpp"
                      ,0xa5,
                      "void basisu::basisu_file::create_comp_data(const basisu_backend_output &)");
      }
      append_vector<basisu::vector<unsigned_char>,unsigned_char>
                (vec,(encoder_output->m_selector_palette).m_p,uVar4);
    }
  }
  uVar4 = (ulong)(encoder_output->m_slice_image_tables).m_size;
  if (uVar4 != 0) {
    if ((this->m_comp_data).m_size != this->m_tables_file_ofs) {
      __assert_fail("m_comp_data.size() == m_tables_file_ofs",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_basis_file.cpp"
                    ,0xac,
                    "void basisu::basisu_file::create_comp_data(const basisu_backend_output &)");
    }
    append_vector<basisu::vector<unsigned_char>,unsigned_char>
              (vec,(encoder_output->m_slice_image_tables).m_p,uVar4);
  }
  if ((this->m_comp_data).m_size != this->m_first_image_file_ofs) {
    __assert_fail("m_comp_data.size() == m_first_image_file_ofs",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_basis_file.cpp"
                  ,0xb0,"void basisu::basisu_file::create_comp_data(const basisu_backend_output &)")
    ;
  }
  if ((encoder_output->m_slice_desc).m_size != 0) {
    uVar5 = 0;
    lVar6 = 8;
    do {
      if ((encoder_output->m_slice_image_data).m_size <= uVar5) {
        __function = 
        "const T &basisu::vector<basisu::vector<unsigned char>>::operator[](size_t) const [T = basisu::vector<unsigned char>]"
        ;
LAB_0020c887:
        __assert_fail("i < m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x177,__function);
      }
      pvVar3 = (encoder_output->m_slice_image_data).m_p;
      uVar4 = (ulong)*(uint *)((long)&pvVar3->m_p + lVar6);
      if (uVar4 == 0) {
        __function = 
        "const T &basisu::vector<unsigned char>::operator[](size_t) const [T = unsigned char]";
        goto LAB_0020c887;
      }
      append_vector<basisu::vector<unsigned_char>,unsigned_char>
                (vec,*(uchar **)((long)pvVar3 + lVar6 + -8),uVar4);
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar5 < (encoder_output->m_slice_desc).m_size);
  }
  if ((this->m_comp_data).m_size == this->m_total_file_size) {
    return;
  }
  __assert_fail("m_comp_data.size() == m_total_file_size",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_basis_file.cpp"
                ,0xb4,"void basisu::basisu_file::create_comp_data(const basisu_backend_output &)");
}

Assistant:

void basisu_file::create_comp_data(const basisu_backend_output &encoder_output)
	{
		const basisu_backend_slice_desc_vec &slice_descs = encoder_output.m_slice_desc;

		append_vector(m_comp_data, reinterpret_cast<const uint8_t *>(&m_header), sizeof(m_header));

		assert(m_comp_data.size() == m_slice_descs_file_ofs);
		append_vector(m_comp_data, reinterpret_cast<const uint8_t*>(&m_images_descs[0]), m_images_descs.size() * sizeof(m_images_descs[0]));

		if (!encoder_output.m_uses_global_codebooks)
		{
			if (encoder_output.m_endpoint_palette.size())
			{
				assert(m_comp_data.size() == m_endpoint_cb_file_ofs);
				append_vector(m_comp_data, reinterpret_cast<const uint8_t*>(&encoder_output.m_endpoint_palette[0]), encoder_output.m_endpoint_palette.size());
			}

			if (encoder_output.m_selector_palette.size())
			{
				assert(m_comp_data.size() == m_selector_cb_file_ofs);
				append_vector(m_comp_data, reinterpret_cast<const uint8_t*>(&encoder_output.m_selector_palette[0]), encoder_output.m_selector_palette.size());
			}
		}

		if (encoder_output.m_slice_image_tables.size())
		{
			assert(m_comp_data.size() == m_tables_file_ofs);
			append_vector(m_comp_data, reinterpret_cast<const uint8_t*>(&encoder_output.m_slice_image_tables[0]), encoder_output.m_slice_image_tables.size());
		}

		assert(m_comp_data.size() == m_first_image_file_ofs);
		for (uint32_t i = 0; i < slice_descs.size(); i++)
			append_vector(m_comp_data, &encoder_output.m_slice_image_data[i][0], encoder_output.m_slice_image_data[i].size());

		assert(m_comp_data.size() == m_total_file_size);
	}